

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

Map_NodeVec_t * Map_MappingDfs(Map_Man_t *pMan,int fCollectEquiv)

{
  undefined1 *puVar1;
  Map_NodeVec_t *vNodes;
  long lVar2;
  
  vNodes = Map_NodeVecAlloc(100);
  if (0 < pMan->nOutputs) {
    lVar2 = 0;
    do {
      Map_MappingDfs_rec((Map_Node_t *)((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe),vNodes,
                         fCollectEquiv);
      lVar2 = lVar2 + 1;
    } while (lVar2 < pMan->nOutputs);
  }
  if (0 < vNodes->nSize) {
    lVar2 = 0;
    do {
      puVar1 = &vNodes->pArray[lVar2]->field_0x1c;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffe;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vNodes->nSize);
  }
  return vNodes;
}

Assistant:

Map_NodeVec_t * Map_MappingDfs( Map_Man_t * pMan, int fCollectEquiv )
{
    Map_NodeVec_t * vNodes;
    int i;
    // perform the traversal
    vNodes = Map_NodeVecAlloc( 100 );
    for ( i = 0; i < pMan->nOutputs; i++ )
        Map_MappingDfs_rec( Map_Regular(pMan->pOutputs[i]), vNodes, fCollectEquiv );
    for ( i = 0; i < vNodes->nSize; i++ )
        vNodes->pArray[i]->fMark0 = 0;
//    for ( i = 0; i < pMan->nOutputs; i++ )
//        Map_MappingUnmark_rec( Map_Regular(pMan->pOutputs[i]) );
    return vNodes;
}